

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_VaryingLengths::_Run(_Test_VaryingLengths *this)

{
  uint uVar1;
  bool b;
  Tester *pTVar2;
  int iVar3;
  int mediocre_filters;
  char buffer [4];
  double rate;
  uint local_204;
  double local_200;
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  Slice local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  int *local_1d0;
  char *local_1c8;
  int local_1c0;
  stringstream local_1b8 [392];
  
  local_1f0 = 0;
  local_1d8 = &(this->super_BloomTest).keys_;
  local_204 = 1;
  local_1f4 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(local_1d8);
    (this->super_BloomTest).filter_._M_string_length = 0;
    *(this->super_BloomTest).filter_._M_dataplus._M_p = '\0';
    if (0 < (int)local_204) {
      iVar3 = 0;
      do {
        local_1c8 = (char *)0x4;
        local_1ec = iVar3;
        local_1d0 = &local_1ec;
        BloomTest::Add(&this->super_BloomTest,(Slice *)&local_1d0);
        iVar3 = iVar3 + 1;
      } while (iVar3 < (int)local_204);
    }
    BloomTest::Build(&this->super_BloomTest);
    local_1d0 = (int *)CONCAT71(local_1d0._1_7_,true);
    local_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc";
    local_1c0 = 0x7c;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_1e8.data_ = (char *)(this->super_BloomTest).filter_._M_string_length;
    iVar3 = local_204 * 10 + 7;
    if (-1 < (int)(local_204 * 10)) {
      iVar3 = local_204 * 10;
    }
    local_200 = (double)(long)((iVar3 >> 3) + 0x28);
    pTVar2 = test::Tester::IsLe<unsigned_long,unsigned_long>
                       ((Tester *)&local_1d0,(unsigned_long *)&local_1e8,(unsigned_long *)&local_200
                       );
    test::Tester::operator<<(pTVar2,(int *)&local_204);
    test::Tester::~Tester((Tester *)&local_1d0);
    local_200 = (double)((ulong)local_200 & 0xffffffff00000000);
    if (0 < (int)local_204) {
      do {
        local_1d0 = (int *)CONCAT71(local_1d0._1_7_,true);
        local_1c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
        ;
        local_1c0 = 0x81;
        std::__cxx11::stringstream::stringstream(local_1b8);
        local_1ec = local_200._0_4_;
        local_1e8.size_ = 4;
        local_1e8.data_ = (char *)&local_1ec;
        b = BloomTest::Matches(&this->super_BloomTest,&local_1e8);
        pTVar2 = test::Tester::Is((Tester *)&local_1d0,b,"Matches(Key(i, buffer))");
        pTVar2 = test::Tester::operator<<(pTVar2,(char (*) [8])"Length ");
        pTVar2 = test::Tester::operator<<(pTVar2,(int *)&local_204);
        pTVar2 = test::Tester::operator<<(pTVar2,(char (*) [7])"; key ");
        test::Tester::operator<<(pTVar2,(int *)&local_200);
        test::Tester::~Tester((Tester *)&local_1d0);
        iVar3 = local_200._0_4_ + 1;
        local_200 = (double)CONCAT44(local_200._4_4_,iVar3);
      } while (iVar3 < (int)local_204);
    }
    local_1e8.data_ = (char *)BloomTest::FalsePositiveRate(&this->super_BloomTest);
    fprintf(_stderr,"False positives: %5.2f%% @ length = %6d ; bytes = %6d\n",
            (double)local_1e8.data_ * 100.0,(ulong)local_204,
            (ulong)(uint)(this->super_BloomTest).filter_._M_string_length);
    local_1d0 = (int *)CONCAT71(local_1d0._1_7_,1);
    local_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc";
    local_1c0 = 0x8b;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_200 = 0.02;
    test::Tester::IsLe<double,double>((Tester *)&local_1d0,(double *)&local_1e8,&local_200);
    test::Tester::~Tester((Tester *)&local_1d0);
    if ((double)local_1e8.data_ <= 0.0125) {
      local_1f4 = local_1f4 + 1;
    }
    else {
      local_1f0 = local_1f0 + 1;
    }
    uVar1 = local_1f4;
    iVar3 = 1;
    if (((9 < (int)local_204) && (iVar3 = 10, 99 < (int)local_204)) &&
       (iVar3 = 1000, (int)local_204 < 1000)) {
      iVar3 = 100;
    }
    local_204 = local_204 + iVar3;
  } while ((int)local_204 < 0x2711);
  fprintf(_stderr,"Filters: %d good, %d mediocre\n",(ulong)local_1f4,(ulong)local_1f0);
  local_1d0 = (int *)CONCAT71(local_1d0._1_7_,true);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc";
  local_1c0 = 0x95;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8.data_ = (char *)CONCAT44(local_1e8.data_._4_4_,(int)uVar1 / 5);
  test::Tester::IsLe<int,int>((Tester *)&local_1d0,(int *)&local_1f0,(int *)&local_1e8);
  test::Tester::~Tester((Tester *)&local_1d0);
  return;
}

Assistant:

TEST(BloomTest, VaryingLengths) {
  char buffer[sizeof(int)];

  // Count number of filters that significantly exceed the false positive rate
  int mediocre_filters = 0;
  int good_filters = 0;

  for (int length = 1; length <= 10000; length = NextLength(length)) {
    Reset();
    for (int i = 0; i < length; i++) {
      Add(Key(i, buffer));
    }
    Build();

    ASSERT_LE(FilterSize(), static_cast<size_t>((length * 10 / 8) + 40))
        << length;

    // All added keys must match
    for (int i = 0; i < length; i++) {
      ASSERT_TRUE(Matches(Key(i, buffer)))
          << "Length " << length << "; key " << i;
    }

    // Check false positive rate
    double rate = FalsePositiveRate();
    if (kVerbose >= 1) {
      fprintf(stderr, "False positives: %5.2f%% @ length = %6d ; bytes = %6d\n",
              rate * 100.0, length, static_cast<int>(FilterSize()));
    }
    ASSERT_LE(rate, 0.02);  // Must not be over 2%
    if (rate > 0.0125)
      mediocre_filters++;  // Allowed, but not too often
    else
      good_filters++;
  }
  if (kVerbose >= 1) {
    fprintf(stderr, "Filters: %d good, %d mediocre\n", good_filters,
            mediocre_filters);
  }
  ASSERT_LE(mediocre_filters, good_filters / 5);
}